

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::MhsWriter::BeginStep(MhsWriter *this,StepMode mode,float timeoutSeconds)

{
  pointer ppEVar1;
  Engine **e;
  pointer ppEVar2;
  
  ppEVar1 = (this->m_SubEngines).
            super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->m_SubEngines).
                 super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1;
      ppEVar2 = ppEVar2 + 1) {
    (*(*ppEVar2)->_vptr_Engine[3])(timeoutSeconds,*ppEVar2,mode);
  }
  return OK;
}

Assistant:

StepStatus MhsWriter::BeginStep(StepMode mode, const float timeoutSeconds)
{
    for (auto &e : m_SubEngines)
    {
        e->BeginStep(mode, timeoutSeconds);
    }
    return StepStatus::OK;
}